

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O0

matrix3 * matrix3_translatev2(matrix3 *self,vector2 *translation)

{
  matrix3 *pmVar1;
  undefined1 local_3c [8];
  matrix3 translationMatrix;
  vector2 *translation_local;
  matrix3 *self_local;
  
  translationMatrix.field_0._28_8_ = translation;
  pmVar1 = matrix3_make_transformation_translationv2((matrix3 *)local_3c,translation);
  pmVar1 = matrix3_multiply(self,pmVar1);
  return pmVar1;
}

Assistant:

HYPAPI struct matrix3 *matrix3_translatev2(struct matrix3 *self, const struct vector2 *translation)
{
	struct matrix3 translationMatrix;

	return matrix3_multiply(self,
		matrix3_make_transformation_translationv2(&translationMatrix, translation));
}